

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareCompatibleSameSizeButDifferentUnits_Test::
Units_compareCompatibleSameSizeButDifferentUnits_Test
          (Units_compareCompatibleSameSizeButDifferentUnits_Test *this)

{
  Units_compareCompatibleSameSizeButDifferentUnits_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Units_compareCompatibleSameSizeButDifferentUnits_Test_001b4d20;
  return;
}

Assistant:

TEST(Units, compareCompatibleSameSizeButDifferentUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");

    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}